

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolutiondepthwise.cpp
# Opt level: O0

int __thiscall ncnn::ConvolutionDepthWise::create_requantize_op(ConvolutionDepthWise *this)

{
  float fVar1;
  Layer *pLVar2;
  reference ppLVar3;
  float *pfVar4;
  long in_RDI;
  Mat weights [1];
  ParamDict pd;
  float scale_out;
  float scale_in;
  int g;
  Mat *in_stack_fffffffffffff5a8;
  int in_stack_fffffffffffff5b0;
  int in_stack_fffffffffffff5b4;
  undefined4 in_stack_fffffffffffff5b8;
  int in_stack_fffffffffffff5bc;
  ParamDict *in_stack_fffffffffffff5c0;
  size_type in_stack_fffffffffffff5c8;
  vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *in_stack_fffffffffffff5d0;
  Mat *local_a18;
  value_type in_stack_fffffffffffff5f0;
  Mat *local_9f0;
  undefined1 local_9c8 [80];
  Mat local_978;
  undefined1 auStack_938 [2332];
  float local_1c;
  float local_18;
  int local_14;
  int local_4;
  
  if ((*(byte *)(in_RDI + 0x20d) & 1) == 0) {
    fprintf(_stderr,"requantized op set but use_int8_requantize disabled\n");
    local_4 = -1;
  }
  else {
    std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::resize
              (in_stack_fffffffffffff5d0,in_stack_fffffffffffff5c8);
    for (local_14 = 0; local_14 < *(int *)(in_RDI + 0xb8); local_14 = local_14 + 1) {
      pLVar2 = create_layer(in_stack_fffffffffffff5bc);
      ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x240)
                           ,(long)local_14);
      *ppLVar3 = pLVar2;
      local_18 = 1.0;
      local_1c = 1.0;
      pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x188),local_14);
      if ((*pfVar4 != 0.0) || (NAN(*pfVar4))) {
        pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x1c8),local_14);
        fVar1 = *pfVar4;
        pfVar4 = Mat::operator[]((Mat *)(in_RDI + 0x188),local_14);
        local_18 = 1.0 / (fVar1 * *pfVar4);
      }
      else {
        local_18 = 0.0;
      }
      local_1c = *(float *)(in_RDI + 0x208);
      ParamDict::ParamDict((ParamDict *)in_stack_fffffffffffff5f0);
      ParamDict::set((ParamDict *)(auStack_938 + 0x18),0,local_18);
      ParamDict::set((ParamDict *)(auStack_938 + 0x18),1,local_1c);
      ParamDict::set((ParamDict *)(auStack_938 + 0x18),2,*(int *)(in_RDI + 0xb0));
      ParamDict::set((ParamDict *)(auStack_938 + 0x18),3,1);
      ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x240)
                           ,(long)local_14);
      (*(*ppLVar3)->_vptr_Layer[2])(*ppLVar3,auStack_938 + 0x18);
      local_9f0 = &local_978;
      do {
        Mat::Mat(local_9f0);
        local_9f0 = local_9f0 + 1;
      } while (local_9f0 != (Mat *)auStack_938);
      Mat::range((Mat *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                 in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0);
      Mat::operator=((Mat *)CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8),
                     (Mat *)CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0));
      Mat::~Mat((Mat *)0x1847d6);
      ppLVar3 = std::vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_>::operator[]
                          ((vector<ncnn::Layer_*,_std::allocator<ncnn::Layer_*>_> *)(in_RDI + 0x240)
                           ,(long)local_14);
      in_stack_fffffffffffff5f0 = *ppLVar3;
      ModelBinFromMatArray::ModelBinFromMatArray
                ((ModelBinFromMatArray *)
                 CONCAT44(in_stack_fffffffffffff5b4,in_stack_fffffffffffff5b0),
                 in_stack_fffffffffffff5a8);
      (*in_stack_fffffffffffff5f0->_vptr_Layer[3])(in_stack_fffffffffffff5f0,local_9c8);
      ModelBinFromMatArray::~ModelBinFromMatArray((ModelBinFromMatArray *)0x184836);
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff5c0,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
      std::vector<float,_std::allocator<float>_>::push_back
                ((vector<float,_std::allocator<float>_> *)in_stack_fffffffffffff5c0,
                 (value_type_conflict2 *)
                 CONCAT44(in_stack_fffffffffffff5bc,in_stack_fffffffffffff5b8));
      local_a18 = (Mat *)auStack_938;
      do {
        local_a18 = local_a18 + -1;
        Mat::~Mat((Mat *)0x18489b);
      } while (local_a18 != &local_978);
      ParamDict::~ParamDict(in_stack_fffffffffffff5c0);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ConvolutionDepthWise::create_requantize_op(void)
{
    if (!use_int8_requantize)
    {
        fprintf(stderr, "requantized op set but use_int8_requantize disabled\n");
        return -1;
    }

    requantize_ops.resize(group);
    for (int g=0; g<group; g++)
    {
        requantize_ops[g] = ncnn::create_layer(ncnn::LayerType::Requantize);

        float scale_in = 1.f;
        float scale_out = 1.f;

        if (weight_data_int8_scales[g] == 0)
        {
            scale_in = 0;
        }
        else
        {
            scale_in = 1.f / (bottom_blob_int8_scales[g] * weight_data_int8_scales[g]);
        }

        scale_out = top_blob_int8_scale;

        ncnn::ParamDict pd;
        pd.set(0, scale_in);   // scale in
        pd.set(1, scale_out);  // scale_out
        pd.set(2, bias_term);  // bias_term
        pd.set(3, 1);          // bias_data_size

        requantize_ops[g]->load_param(pd);

        ncnn::Mat weights[1];
        weights[0] = bias_data.range(g, 1);

        requantize_ops[g]->load_model(ModelBinFromMatArray(weights));

        requantize_scales.push_back(scale_in);
        requantize_scales.push_back(scale_out);
    }

    return 0;
}